

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O0

void __thiscall
diy::Master::Command<PointBlock<3U>_>::execute
          (Command<PointBlock<3U>_> *this,void *b,ProxyWithLink *cp)

{
  ProxyWithLink *in_RSI;
  PointBlock<3U> *in_RDI;
  
  std::function<void_(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&)>::operator()
            ((function<void_(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&)> *)cp,in_RDI,
             in_RSI);
  return;
}

Assistant:

void  execute(void* b, const ProxyWithLink& cp) const override                { f(static_cast<Block*>(b), cp); }